

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

void __thiscall toml::Value::Value(Value *this,string *v)

{
  string *this_00;
  string *in_RSI;
  undefined4 *in_RDI;
  
  *in_RDI = 4;
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string(this_00,in_RSI);
  *(string **)(in_RDI + 2) = this_00;
  return;
}

Assistant:

Value(const std::string& v) : type_(STRING_TYPE), string_(new std::string(v)) {}